

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

void cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)

{
  cJSON *pcVar1;
  cJSON *pcVar2;
  ulong uVar3;
  cJSON **ppcVar4;
  bool bVar5;
  
  if (array != (cJSON *)0x0 && -1 < which) {
    uVar3 = (ulong)(uint)which;
    ppcVar4 = &array->child;
    pcVar1 = (cJSON *)ppcVar4;
    do {
      pcVar1 = pcVar1->next;
      bVar5 = uVar3 != 0;
      uVar3 = uVar3 - 1;
      if (pcVar1 == (cJSON *)0x0) break;
    } while (bVar5);
    if (pcVar1 == (cJSON *)0x0) {
      if (newitem != (cJSON *)0x0) {
        pcVar1 = *ppcVar4;
        if (*ppcVar4 != (cJSON *)0x0) {
          do {
            pcVar2 = pcVar1;
            pcVar1 = pcVar2->next;
          } while (pcVar2->next != (cJSON *)0x0);
          pcVar2->next = newitem;
          newitem->prev = pcVar2;
          return;
        }
        goto LAB_00103637;
      }
    }
    else {
      newitem->next = pcVar1;
      newitem->prev = pcVar1->prev;
      pcVar1->prev = newitem;
      if (pcVar1 == *ppcVar4) {
LAB_00103637:
        *ppcVar4 = newitem;
        return;
      }
      newitem->prev->next = newitem;
    }
  }
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_InsertItemInArray(cJSON *array, int which, cJSON *newitem)
{
    cJSON *after_inserted = NULL;

    if (which < 0)
    {
        return;
    }

    after_inserted = get_array_item(array, (size_t)which);
    if (after_inserted == NULL)
    {
        cJSON_AddItemToArray(array, newitem);
        return;
    }

    newitem->next = after_inserted;
    newitem->prev = after_inserted->prev;
    after_inserted->prev = newitem;
    if (after_inserted == array->child)
    {
        array->child = newitem;
    }
    else
    {
        newitem->prev->next = newitem;
    }
}